

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O1

bool uWS::WebSocketContext<false,_true>::handleFragment
               (char *data,size_t length,uint remainingBytes,int opCode,bool fin,
               WebSocketState<true> *webSocketState,void *s)

{
  string_view compressed;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  uchar *s_00;
  ushort *__buf;
  char *pcVar9;
  ushort *s_01;
  size_t sVar10;
  bool bVar11;
  string_view compressed_00;
  string_view message;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_48;
  
  uVar2 = us_socket_context(0,s);
  lVar3 = us_socket_context_ext(0,uVar2);
  lVar4 = us_socket_ext(0);
  bVar11 = remainingBytes != 0;
  if (opCode < 3) {
    if ((bVar11 || !fin) || (*(long *)(lVar4 + 0x40) != 0)) {
      pcVar9 = (char *)(lVar4 + 0x38);
      if (*(long *)(lVar4 + 0x40) == 0) {
        std::__cxx11::string::reserve((ulong)pcVar9);
      }
      lVar6 = *(long *)(lVar4 + 0x40);
      uVar2 = us_socket_context(0,s);
      lVar5 = us_socket_context_ext(0,uVar2);
      if (lVar6 + length <= *(ulong *)(lVar5 + 0xa0)) {
        std::__cxx11::string::append(pcVar9,(ulong)data);
        if (!bVar11 && fin) {
          if (*(char *)(lVar4 + 0x5d) == '\x02') {
            *(undefined1 *)(lVar4 + 0x5d) = 1;
            std::__cxx11::string::append(pcVar9);
            uVar2 = us_socket_context(0,s);
            uVar2 = us_socket_context_loop(0,uVar2);
            lVar6 = us_loop_ext(uVar2);
            compressed_00._M_len = *(long *)(lVar4 + 0x40) - 4;
            compressed_00._M_str = *(char **)(lVar4 + 0x38);
            InflationStream::inflate
                      (&local_48,*(InflationStream **)(lVar6 + 0xe0),*(ZlibContext **)(lVar6 + 0xd8)
                       ,compressed_00,*(size_t *)(lVar3 + 0xa0));
            s_00 = (uchar *)local_48.first._M_str;
            sVar10 = local_48.first._M_len;
            if (local_48.second == false) {
              us_socket_close(0,s);
              return true;
            }
          }
          else {
            s_00 = *(uchar **)(lVar4 + 0x38);
            sVar10 = *(size_t *)(lVar4 + 0x40);
          }
          if ((opCode == 1) && (bVar11 = protocol::isValidUtf8(s_00,sVar10), !bVar11))
          goto LAB_00143828;
          bVar11 = fu2::abi_400::detail::type_erasure::tables::
                   vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                   ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                            *)(lVar3 + 0x10));
          if (!bVar11) {
            (**(code **)(lVar3 + 0x18))(lVar3,0x10,s,sVar10,s_00,opCode & 0xff);
            iVar1 = us_socket_is_closed(0,s);
            if (iVar1 != 0) {
              return true;
            }
            if (*(char *)(lVar4 + 0x5c) != '\0') {
              return true;
            }
          }
          *(undefined8 *)(lVar4 + 0x40) = 0;
          **(undefined1 **)(lVar4 + 0x38) = 0;
        }
        goto LAB_00143d89;
      }
    }
    else {
      if (*(char *)(lVar4 + 0x5d) == '\x02') {
        *(undefined1 *)(lVar4 + 0x5d) = 1;
        uVar2 = us_socket_context(0,s);
        uVar2 = us_socket_context_loop(0,uVar2);
        lVar6 = us_loop_ext(uVar2);
        compressed._M_str = data;
        compressed._M_len = length;
        InflationStream::inflate
                  (&local_48,*(InflationStream **)(lVar6 + 0xe0),*(ZlibContext **)(lVar6 + 0xd8),
                   compressed,*(size_t *)(lVar3 + 0xa0));
        data = local_48.first._M_str;
        length = local_48.first._M_len;
        if (local_48.second == false) {
          us_socket_close(0,s);
          return true;
        }
      }
      if ((opCode != 1) || (bVar11 = protocol::isValidUtf8((uchar *)data,length), bVar11)) {
        bVar11 = fu2::abi_400::detail::type_erasure::tables::
                 vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                 ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                          *)(lVar3 + 0x10));
        if (!bVar11) {
          (**(code **)(lVar3 + 0x18))(lVar3,0x10,s,length,data,opCode & 0xff);
          goto LAB_00143d6c;
        }
        goto LAB_00143d89;
      }
    }
LAB_00143828:
    us_socket_close(0,s);
LAB_00143da6:
    bVar11 = true;
  }
  else {
    if ((bVar11 || !fin) || (*(int *)(lVar4 + 0x58) != 0)) {
      std::__cxx11::string::append((char *)(lVar4 + 0x38),(ulong)data);
      lVar6 = (long)(int)length + (long)*(int *)(lVar4 + 0x58);
      uVar8 = (uint)lVar6;
      *(uint *)(lVar4 + 0x58) = uVar8;
      if (!bVar11 && fin) {
        if (opCode == 10) {
          bVar11 = fu2::abi_400::detail::type_erasure::tables::
                   vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
                   ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
                            *)(lVar3 + 0x90));
          if (!bVar11) {
            (**(code **)(lVar3 + 0x98))(lVar3 + 0x80,0x10,s);
LAB_00143b81:
            iVar1 = us_socket_is_closed(0,s);
            if (iVar1 != 0) {
              return true;
            }
            if (*(char *)(lVar4 + 0x5c) != '\0') {
              return true;
            }
          }
        }
        else {
          __buf = (ushort *)((*(long *)(lVar4 + 0x38) + *(long *)(lVar4 + 0x40)) - lVar6);
          if (opCode == 9) {
            WebSocket<false,_true>::send((WebSocket<false,_true> *)s,uVar8,__buf,10,0);
            bVar11 = fu2::abi_400::detail::type_erasure::tables::
                     vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
                     ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
                              *)(lVar3 + 0x70));
            if (!bVar11) {
              (**(code **)(lVar3 + 0x78))(lVar3 + 0x60,0x10,s);
              goto LAB_00143b81;
            }
          }
          else if (opCode == 8) {
            if (uVar8 < 2) {
              sVar10 = 0;
              s_01 = (ushort *)0x0;
              uVar8 = 0;
            }
            else {
              uVar7 = *__buf << 8 | *__buf >> 8;
              s_01 = (ushort *)0x0;
              sVar10 = 0;
              uVar8 = 0;
              if (2 < (ushort)(uVar7 - 0x3ec) &&
                  (0xbab < (ushort)(uVar7 - 0x3f4) && 0xf05f < (ushort)(uVar7 + 0xec78))) {
                sVar10 = lVar6 - 2;
                s_01 = __buf + 1;
                bVar11 = protocol::isValidUtf8((uchar *)s_01,sVar10);
                uVar8 = (uint)uVar7;
                if (!bVar11) {
                  s_01 = (ushort *)0x0;
                  sVar10 = 0;
                  uVar8 = 0;
                }
              }
            }
            goto LAB_00143d9e;
          }
        }
        std::__cxx11::string::resize
                  ((ulong)(lVar4 + 0x38),
                   (char)*(undefined8 *)(lVar4 + 0x40) - (char)*(undefined4 *)(lVar4 + 0x58));
        *(undefined4 *)(lVar4 + 0x58) = 0;
      }
    }
    else if (opCode == 10) {
      bVar11 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
                        *)(lVar3 + 0x90));
      if (!bVar11) {
        (**(code **)(lVar3 + 0x98))(lVar3 + 0x80,0x10,s);
LAB_00143d6c:
        iVar1 = us_socket_is_closed(0,s);
        if (iVar1 != 0) {
          return true;
        }
        if (*(char *)(lVar4 + 0x5c) != '\0') {
          return true;
        }
      }
    }
    else if (opCode == 9) {
      WebSocket<false,_true>::send((WebSocket<false,_true> *)s,(int)length,data,10,0);
      bVar11 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
                        *)(lVar3 + 0x70));
      if (!bVar11) {
        (**(code **)(lVar3 + 0x78))(lVar3 + 0x60,0x10,s);
        goto LAB_00143d6c;
      }
    }
    else if (opCode == 8) {
      if (length < 2) {
        sVar10 = 0;
        s_01 = (ushort *)0x0;
        uVar8 = 0;
      }
      else {
        uVar7 = *(ushort *)data << 8 | *(ushort *)data >> 8;
        s_01 = (ushort *)0x0;
        sVar10 = 0;
        uVar8 = 0;
        if (2 < (ushort)(uVar7 - 0x3ec) &&
            (0xbab < (ushort)(uVar7 - 0x3f4) && 0xf05f < (ushort)(uVar7 + 0xec78))) {
          sVar10 = length - 2;
          s_01 = (ushort *)(data + 2);
          bVar11 = protocol::isValidUtf8((uchar *)s_01,sVar10);
          uVar8 = (uint)uVar7;
          if (!bVar11) {
            s_01 = (ushort *)0x0;
            sVar10 = 0;
            uVar8 = 0;
          }
        }
      }
LAB_00143d9e:
      message._M_str = (char *)s_01;
      message._M_len = sVar10;
      WebSocket<false,_true>::end((WebSocket<false,_true> *)s,uVar8,message);
      goto LAB_00143da6;
    }
LAB_00143d89:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool handleFragment(char *data, size_t length, unsigned int remainingBytes, int opCode, bool fin, uWS::WebSocketState<isServer> *webSocketState, void *s) {
        /* WebSocketData and WebSocketContextData */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL, us_socket_context(SSL, (us_socket_t *) s));
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) s);

        /* Is this a non-control frame? */
        if (opCode < 3) {
            /* Did we get everything in one go? */
            if (!remainingBytes && fin && !webSocketData->fragmentBuffer.length()) {

                /* Handle compressed frame */
                if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                        webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                        LoopData *loopData = (LoopData *) us_loop_ext(us_socket_context_loop(SSL, us_socket_context(SSL, (us_socket_t *) s)));
                        auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {data, length}, webSocketContextData->maxPayloadLength);
                        if (!valid) {
                            forceClose(webSocketState, s);
                            return true;
                        } else {
                            data = (char *) inflatedFrame.data();
                            length = inflatedFrame.length();
                        }
                }

                /* Check text messages for Utf-8 validity */
                if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                    forceClose(webSocketState, s);
                    return true;
                }

                /* Emit message event & break if we are closed or shut down when returning */
                if (webSocketContextData->messageHandler) {
                    webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                    if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                        return true;
                    }
                }
            } else {
                /* Allocate fragment buffer up front first time */
                if (!webSocketData->fragmentBuffer.length()) {
                    webSocketData->fragmentBuffer.reserve(length + remainingBytes);
                }
                /* Fragments forming a big message are not caught until appending them */
                if (refusePayloadLength(length + webSocketData->fragmentBuffer.length(), webSocketState, s)) {
                    forceClose(webSocketState, s);
                    return true;
                }
                webSocketData->fragmentBuffer.append(data, length);

                /* Are we done now? */
                // todo: what if we don't have any remaining bytes yet we are not fin? forceclose!
                if (!remainingBytes && fin) {

                    /* Handle compression */
                    if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                            webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                            // what's really the story here?
                            webSocketData->fragmentBuffer.append("....");

                            LoopData *loopData = (LoopData *) us_loop_ext(
                                us_socket_context_loop(SSL,
                                    us_socket_context(SSL, (us_socket_t *) s)
                                )
                            );

                            auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {webSocketData->fragmentBuffer.data(), webSocketData->fragmentBuffer.length() - 4}, webSocketContextData->maxPayloadLength);
                            if (!valid) {
                                forceClose(webSocketState, s);
                                return true;
                            } else {
                                data = (char *) inflatedFrame.data();
                                length = inflatedFrame.length();
                            }


                    } else {
                        // reset length and data ptrs
                        length = webSocketData->fragmentBuffer.length();
                        data = webSocketData->fragmentBuffer.data();
                    }

                    /* Check text messages for Utf-8 validity */
                    if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                        forceClose(webSocketState, s);
                        return true;
                    }

                    /* Emit message and check for shutdown or close */
                    if (webSocketContextData->messageHandler) {
                        webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                        if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                            return true;
                        }
                    }

                    /* If we shutdown or closed, this will be taken care of elsewhere */
                    webSocketData->fragmentBuffer.clear();
                }
            }
        } else {
            /* Control frames need the websocket to send pings, pongs and close */
            WebSocket<SSL, isServer> *webSocket = (WebSocket<SSL, isServer> *) s;

            if (!remainingBytes && fin && !webSocketData->controlTipLength) {
                if (opCode == CLOSE) {
                    auto closeFrame = protocol::parseClosePayload(data, length);
                    webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                    return true;
                } else {
                    if (opCode == PING) {
                        webSocket->send(std::string_view(data, length), (OpCode) OpCode::PONG);
                        if (webSocketContextData->pingHandler) {
                            webSocketContextData->pingHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    } else if (opCode == PONG) {
                        if (webSocketContextData->pongHandler) {
                            webSocketContextData->pongHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    }
                }
            } else {
                /* Here we never mind any size optimizations as we are in the worst possible path */
                webSocketData->fragmentBuffer.append(data, length);
                webSocketData->controlTipLength += (int) length;

                if (!remainingBytes && fin) {
                    char *controlBuffer = (char *) webSocketData->fragmentBuffer.data() + webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength;
                    if (opCode == CLOSE) {
                        protocol::CloseFrame closeFrame = protocol::parseClosePayload(controlBuffer, webSocketData->controlTipLength);
                        webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                        return true;
                    } else {
                        if (opCode == PING) {
                            webSocket->send(std::string_view(controlBuffer, webSocketData->controlTipLength), (OpCode) OpCode::PONG);
                            if (webSocketContextData->pingHandler) {
                                webSocketContextData->pingHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        } else if (opCode == PONG) {
                            if (webSocketContextData->pongHandler) {
                                webSocketContextData->pongHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        }
                    }

                    /* Same here, we do not care for any particular smart allocation scheme */
                    webSocketData->fragmentBuffer.resize(webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength);
                    webSocketData->controlTipLength = 0;
                }
            }
        }
        return false;
    }